

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O2

void lshift8(void *blob,int nbytes,int c)

{
  uint uVar1;
  ulong uVar2;
  undefined1 uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  if (c != 0) {
    uVar1 = c >> 3;
    uVar5 = nbytes - 1;
    for (lVar4 = (long)(int)uVar5; (int)uVar1 <= lVar4; lVar4 = lVar4 + -1) {
      *(undefined1 *)((long)blob + lVar4) = *(undefined1 *)((long)blob + (lVar4 - (int)uVar1));
    }
    for (uVar2 = (ulong)uVar1; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      *(undefined1 *)((long)blob + (uVar2 - 1)) = 0;
    }
    if ((c & 7U) != 0) {
      while (-1 < (int)uVar5) {
        uVar2 = (ulong)uVar5;
        bVar6 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar6) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(undefined1 *)((long)blob + (uVar2 - 1));
        }
        *(char *)((long)blob + uVar2) =
             (char)(((uint)CONCAT11(*(undefined1 *)((long)blob + uVar2),uVar3) << ((byte)c & 7)) >>
                   8);
      }
    }
  }
  return;
}

Assistant:

void lshift8 ( void * blob, int nbytes, int c )
{
  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  int b = c >> 3;
  c &= 7;

  for(int i = nbytes-1; i >= b; i--)
  {
    k[i] = k[i-b];
  }

  for(int i = b-1; i >= 0; i--)
  {
    k[i] = 0;
  }

  if(c == 0) return;

  for(int i = nbytes-1; i >= 0; i--)
  {
    uint8_t a = k[i];
    uint8_t b = (i == 0) ? 0 : k[i-1];

    k[i] = (a << c) | (b >> (8-c));
  }
}